

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# prime_test.cpp
# Opt level: O1

void __thiscall ISPRIME_Negative_Test::TestBody(ISPRIME_Negative_Test *this)

{
  bool bVar1;
  char *message;
  initializer_list<bool> __l;
  initializer_list<bool> __l_00;
  undefined1 local_80 [8];
  vector<bool,_std::allocator<bool>_> res;
  AssertionResult gtest_ar;
  AssertHelper local_20;
  allocator_type local_11;
  
  bVar1 = isprime(-1);
  gtest_ar.message_.ptr_._0_1_ = bVar1;
  bVar1 = isprime(-0x1475);
  gtest_ar.message_.ptr_._1_1_ = bVar1;
  bVar1 = isprime(-0xefedb1);
  gtest_ar.message_.ptr_._2_1_ = bVar1;
  bVar1 = isprime(-2);
  gtest_ar.message_.ptr_._3_1_ = bVar1;
  __l._M_len = 4;
  __l._M_array = (iterator)&gtest_ar.message_;
  std::vector<bool,_std::allocator<bool>_>::vector
            ((vector<bool,_std::allocator<bool>_> *)local_80,__l,
             (allocator_type *)
             &res.super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data.
              _M_end_of_storage);
  local_20.data_._0_4_ = 0;
  __l_00._M_len = 4;
  __l_00._M_array = (iterator)&local_20;
  std::vector<bool,_std::allocator<bool>_>::vector
            ((vector<bool,_std::allocator<bool>_> *)&gtest_ar.message_,__l_00,&local_11);
  testing::internal::
  CmpHelperEQ<std::vector<bool,std::allocator<bool>>,std::vector<bool,std::allocator<bool>>>
            ((internal *)
             &res.super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data.
              _M_end_of_storage,"res","(vector<bool> {false, false, false, false})",
             (vector<bool,_std::allocator<bool>_> *)local_80,
             (vector<bool,_std::allocator<bool>_> *)&gtest_ar.message_);
  if (gtest_ar.message_.ptr_ !=
      (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
    operator_delete(gtest_ar.message_.ptr_);
    gtest_ar.message_.ptr_ =
         (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
  }
  if ((char)res.super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data.
            _M_end_of_storage == '\0') {
    testing::Message::Message((Message *)&gtest_ar.message_);
    if (gtest_ar._0_8_ == 0) {
      message = "";
    }
    else {
      message = *(char **)gtest_ar._0_8_;
    }
    testing::internal::AssertHelper::AssertHelper
              (&local_20,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/trinerdi[P]icpc-notebook/src/trinerdi/number-theory/prime_test.cpp"
               ,7,message);
    testing::internal::AssertHelper::operator=(&local_20,(Message *)&gtest_ar.message_);
    testing::internal::AssertHelper::~AssertHelper(&local_20);
    if (gtest_ar.message_.ptr_ !=
        (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      bVar1 = testing::internal::IsTrue(true);
      if ((bVar1) &&
         (gtest_ar.message_.ptr_ !=
          (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0)) {
        (**(code **)(((gtest_ar.message_.ptr_)->_M_dataplus)._M_p + 8))();
      }
      gtest_ar.message_.ptr_ =
           (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
    }
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  reset((scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
         *)&gtest_ar,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
  if (local_80 != (undefined1  [8])0x0) {
    operator_delete((void *)local_80);
  }
  return;
}

Assistant:

TEST(ISPRIME, Negative) {
	vector<bool> res = {isprime(-1), isprime(-5237), isprime(-15723953), isprime(-2)};
	EXPECT_EQ(res, (vector<bool> {false, false, false, false}));
}